

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrintColorEncoded(char *str)

{
  char cVar1;
  GTestColor color_00;
  char *__beg;
  char *__end;
  undefined8 uVar2;
  char ch;
  allocator<char> local_41;
  string local_40 [32];
  char *local_20;
  char *p;
  char *pcStack_10;
  GTestColor color;
  char *str_local;
  
  p._4_4_ = COLOR_DEFAULT;
  pcStack_10 = str;
  while (__end = strchr(pcStack_10,0x40), __beg = pcStack_10, color_00 = p._4_4_, local_20 = __end,
        __end != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_40,__beg,__end,&local_41);
    uVar2 = std::__cxx11::string::c_str();
    ColoredPrintf(color_00,"%s",uVar2);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    cVar1 = local_20[1];
    pcStack_10 = local_20 + 2;
    if (cVar1 == '@') {
      ColoredPrintf(p._4_4_,"@");
    }
    else if (cVar1 == 'D') {
      p._4_4_ = COLOR_DEFAULT;
    }
    else if (cVar1 == 'R') {
      p._4_4_ = COLOR_RED;
    }
    else if (cVar1 == 'G') {
      p._4_4_ = COLOR_GREEN;
    }
    else if (cVar1 == 'Y') {
      p._4_4_ = COLOR_YELLOW;
    }
    else {
      pcStack_10 = local_20 + 1;
    }
  }
  ColoredPrintf(p._4_4_,"%s",pcStack_10);
  return;
}

Assistant:

static void PrintColorEncoded(const char* str) {
  GTestColor color = COLOR_DEFAULT;  // The current color.

  // Conceptually, we split the string into segments divided by escape
  // sequences.  Then we print one segment at a time.  At the end of
  // each iteration, the str pointer advances to the beginning of the
  // next segment.
  for (;;) {
    const char* p = strchr(str, '@');
    if (p == NULL) {
      ColoredPrintf(color, "%s", str);
      return;
    }

    ColoredPrintf(color, "%s", std::string(str, p).c_str());

    const char ch = p[1];
    str = p + 2;
    if (ch == '@') {
      ColoredPrintf(color, "@");
    } else if (ch == 'D') {
      color = COLOR_DEFAULT;
    } else if (ch == 'R') {
      color = COLOR_RED;
    } else if (ch == 'G') {
      color = COLOR_GREEN;
    } else if (ch == 'Y') {
      color = COLOR_YELLOW;
    } else {
      --str;
    }
  }
}